

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

nk_vec2 nk_text_calculate_text_bounds
                  (nk_user_font *font,char *begin,int byte_len,float row_height,char **remaining,
                  nk_vec2 *out_offset,int *glyphs,int op)

{
  long lVar1;
  char *pcVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  char *pcVar7;
  int iVar8;
  long lVar9;
  nk_vec2 nVar10;
  undefined4 in_XMM0_Db;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  nk_vec2 nVar13;
  nk_rune unicode;
  nk_rune local_bc;
  char *local_b8;
  float local_ac;
  int *local_a8;
  nk_vec2 *local_a0;
  char **local_98;
  char *local_90;
  int local_84;
  ulong local_80;
  float local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  nk_handle *local_60;
  char *local_58;
  ulong local_50;
  float local_48;
  undefined4 uStack_44;
  
  local_bc = 0;
  if (((font == (nk_user_font *)0x0) || (begin == (char *)0x0)) || (byte_len < 1)) {
    nVar10 = (nk_vec2)((ulong)(uint)row_height << 0x20);
  }
  else {
    local_a8 = glyphs;
    local_48 = row_height;
    uStack_44 = in_XMM0_Db;
    iVar3 = nk_utf_decode(begin,&local_bc,byte_len);
    if (iVar3 == 0) {
      nVar10.x = 0.0;
      nVar10.y = 0.0;
    }
    else {
      local_a0 = out_offset;
      local_98 = remaining;
      local_60 = &font->userdata;
      local_ac = (*font->width)(font->userdata,font->height,begin,iVar3);
      *local_a8 = 0;
      local_58 = begin + 1;
      local_78 = 0.0;
      uStack_74 = 0;
      uStack_70 = 0;
      uStack_6c = 0;
      uVar6 = 0;
      local_90 = begin;
      local_84 = byte_len;
      local_50 = (ulong)(uint)byte_len;
      do {
        pcVar2 = local_58;
        iVar4 = (int)uVar6;
        local_80 = (ulong)(uint)(local_84 - iVar4);
        iVar8 = -1;
        lVar9 = 0;
        local_b8 = (char *)uVar6;
        while (pcVar7 = local_90, local_bc == 0xd) {
          *local_a8 = *local_a8 + 1;
          lVar1 = (long)iVar4 + 1 + lVar9;
          iVar3 = nk_utf_decode(pcVar2 + lVar9 + iVar4,&local_bc,(int)local_80 + iVar8);
          lVar9 = lVar9 + 1;
          if (((long)local_50 <= lVar1) || (iVar8 = iVar8 + -1, iVar3 == 0)) {
            iVar4 = (int)local_b8 + (int)lVar9;
            auVar11 = ZEXT816(0);
            pcVar7 = local_90;
            goto LAB_0014718e;
          }
        }
        iVar8 = (int)lVar9;
        if (local_bc == 10) {
          iVar4 = (int)local_b8 + iVar8;
          if (local_78 <= 0.0) {
            local_78 = 0.0;
          }
          *local_a8 = *local_a8 + 1;
          auVar11._4_4_ = local_48 + 0.0;
          auVar11._0_4_ = local_78;
          auVar11._8_4_ = uStack_74;
          auVar11._12_4_ = uStack_44;
          local_78 = 0.0;
          goto LAB_0014718e;
        }
        *local_a8 = *local_a8 + 1;
        iVar4 = (int)local_b8 + iVar3;
        uVar5 = iVar4 + iVar8;
        uVar6 = (ulong)uVar5;
        local_78 = local_78 + local_ac;
        local_b8 = local_90 + (int)uVar5;
        iVar3 = nk_utf_decode(local_b8,&local_bc,((int)local_80 - iVar3) - iVar8);
        local_ac = (*(code *)local_60[2])(*local_60,(float)local_60[1].id,local_b8,iVar3);
      } while (((int)uVar5 < local_84) && (iVar3 != 0));
      iVar4 = iVar4 + iVar8;
      auVar11 = ZEXT416(0);
LAB_0014718e:
      nVar10 = auVar11._0_8_;
      if (auVar11._0_4_ < local_78) {
        auVar12._4_12_ = auVar11._4_12_;
        auVar12._0_4_ = local_78;
        nVar10 = auVar12._0_8_;
      }
      local_48 = nVar10.y + local_48;
      if (local_a0 != (nk_vec2 *)0x0) {
        nVar13.y = local_48;
        nVar13.x = local_78;
        *local_a0 = nVar13;
      }
      if (nVar10.y == 0.0 || 0.0 < local_78) {
        nVar10.y = local_48;
      }
      if (local_98 != (char **)0x0) {
        *local_98 = pcVar7 + iVar4;
      }
    }
  }
  return nVar10;
}

Assistant:

NK_LIB struct nk_vec2
nk_text_calculate_text_bounds(const struct nk_user_font *font,
    const char *begin, int byte_len, float row_height, const char **remaining,
    struct nk_vec2 *out_offset, int *glyphs, int op)
{
    float line_height = row_height;
    struct nk_vec2 text_size = nk_vec2(0,0);
    float line_width = 0.0f;

    float glyph_width;
    int glyph_len = 0;
    nk_rune unicode = 0;
    int text_len = 0;
    if (!begin || byte_len <= 0 || !font)
        return nk_vec2(0,row_height);

    glyph_len = nk_utf_decode(begin, &unicode, byte_len);
    if (!glyph_len) return text_size;
    glyph_width = font->width(font->userdata, font->height, begin, glyph_len);

    *glyphs = 0;
    while ((text_len < byte_len) && glyph_len) {
        if (unicode == '\n') {
            text_size.x = NK_MAX(text_size.x, line_width);
            text_size.y += line_height;
            line_width = 0;
            *glyphs+=1;
            if (op == NK_STOP_ON_NEW_LINE)
                break;

            text_len++;
            glyph_len = nk_utf_decode(begin + text_len, &unicode, byte_len-text_len);
            continue;
        }

        if (unicode == '\r') {
            text_len++;
            *glyphs+=1;
            glyph_len = nk_utf_decode(begin + text_len, &unicode, byte_len-text_len);
            continue;
        }

        *glyphs = *glyphs + 1;
        text_len += glyph_len;
        line_width += (float)glyph_width;
        glyph_len = nk_utf_decode(begin + text_len, &unicode, byte_len-text_len);
        glyph_width = font->width(font->userdata, font->height, begin+text_len, glyph_len);
        continue;
    }

    if (text_size.x < line_width)
        text_size.x = line_width;
    if (out_offset)
        *out_offset = nk_vec2(line_width, text_size.y + line_height);
    if (line_width > 0 || text_size.y == 0.0f)
        text_size.y += line_height;
    if (remaining)
        *remaining = begin+text_len;
    return text_size;
}